

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

bool __thiscall QDialogPrivate::canBeNativeDialog(QDialogPrivate *this)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  undefined8 extraout_RDX;
  
  cVar1 = QCoreApplication::testAttribute(AA_DontUseNativeDialogs);
  if (cVar1 == '\0') {
    iVar3 = themeDialogType(*(QDialog **)&(this->super_QWidgetPrivate).field_0x8);
    if (-1 < iVar3) {
      uVar2 = (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x30))
                        (QGuiApplicationPrivate::platform_theme,iVar3,extraout_RDX,
                         *(code **)(*QGuiApplicationPrivate::platform_theme + 0x30));
      return (bool)uVar2;
    }
  }
  return false;
}

Assistant:

bool QDialogPrivate::canBeNativeDialog() const
{
    if (QCoreApplication::testAttribute(Qt::AA_DontUseNativeDialogs))
        return false;

    QDialogPrivate *ncThis = const_cast<QDialogPrivate *>(this);
    QDialog *dialog = ncThis->q_func();
    const int type = themeDialogType(dialog);
    if (type >= 0)
        return QGuiApplicationPrivate::platformTheme()
                ->usePlatformNativeDialog(static_cast<QPlatformTheme::DialogType>(type));
    return false;
}